

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_smr(REF_DBL *metric0,REF_DBL *metric1,REF_DBL *metric,REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS RVar2;
  double dVar3;
  double local_270;
  double local_268;
  double local_260;
  double local_258;
  double local_248;
  double local_240;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_DBL eig;
  REF_DBL h2;
  REF_DBL hmin;
  REF_DBL hmax;
  REF_DBL h;
  REF_DBL h1;
  REF_DBL h0;
  REF_DBL diagonal_system [12];
  REF_DBL inv_n_vectors [9];
  REF_DBL local_128;
  REF_DBL n_vectors [9];
  REF_DBL local_d8;
  REF_DBL n_values [3];
  REF_DBL local_b8;
  REF_DBL inv_m1_m2 [9];
  REF_DBL local_68;
  REF_DBL metric_inv [6];
  REF_INT node;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  REF_DBL *metric1_local;
  REF_DBL *metric0_local;
  
  metric_inv[5]._4_4_ = 0;
  do {
    if (ref_grid->node->max <= metric_inv[5]._4_4_) {
      return 0;
    }
    if (((-1 < metric_inv[5]._4_4_) && (metric_inv[5]._4_4_ < ref_grid->node->max)) &&
       (-1 < ref_grid->node->global[metric_inv[5]._4_4_])) {
      uVar1 = ref_matrix_inv_m(metric0 + metric_inv[5]._4_4_ * 6,&local_68);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x712,"ref_metric_smr",(ulong)uVar1,"inv");
        return uVar1;
      }
      uVar1 = ref_matrix_mult_m(&local_68,metric1 + metric_inv[5]._4_4_ * 6,&local_b8);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x713,"ref_metric_smr",(ulong)uVar1,"mult");
        return uVar1;
      }
      uVar1 = ref_matrix_diag_gen(3,&local_b8,&local_d8,&local_128);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x714,"ref_metric_smr",(ulong)uVar1,"gen eig");
        return uVar1;
      }
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        dVar3 = sqrt(n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + 1] *
                     (metric0[(long)(metric_inv[5]._4_4_ * 6) + 5] *
                      n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + 1] +
                     metric0[(long)(metric_inv[5]._4_4_ * 6) + 2] *
                     n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + -1] +
                     metric0[(long)(metric_inv[5]._4_4_ * 6) + 4] *
                     n_vectors[ref_private_macro_code_rss_1 * 3]) +
                     n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + -1] *
                     (metric0[(long)(metric_inv[5]._4_4_ * 6) + 2] *
                      n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + 1] +
                     metric0[metric_inv[5]._4_4_ * 6] *
                     n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + -1] +
                     metric0[(long)(metric_inv[5]._4_4_ * 6) + 1] *
                     n_vectors[ref_private_macro_code_rss_1 * 3]) +
                     n_vectors[ref_private_macro_code_rss_1 * 3] *
                     (metric0[(long)(metric_inv[5]._4_4_ * 6) + 4] *
                      n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + 1] +
                     metric0[(long)(metric_inv[5]._4_4_ * 6) + 1] *
                     n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + -1] +
                     metric0[(long)(metric_inv[5]._4_4_ * 6) + 3] *
                     n_vectors[ref_private_macro_code_rss_1 * 3]));
        if (dVar3 * 1e+20 <= 0.0) {
          local_240 = -(dVar3 * 1e+20);
        }
        else {
          local_240 = dVar3 * 1e+20;
        }
        if (local_240 <= 1.0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x717,"ref_metric_smr",4,"inf h0");
          return 4;
        }
        local_268 = sqrt(n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + 1] *
                         (metric1[(long)(metric_inv[5]._4_4_ * 6) + 5] *
                          n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + 1] +
                         metric1[(long)(metric_inv[5]._4_4_ * 6) + 2] *
                         n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + -1] +
                         metric1[(long)(metric_inv[5]._4_4_ * 6) + 4] *
                         n_vectors[ref_private_macro_code_rss_1 * 3]) +
                         n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + -1] *
                         (metric1[(long)(metric_inv[5]._4_4_ * 6) + 2] *
                          n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + 1] +
                         metric1[metric_inv[5]._4_4_ * 6] *
                         n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + -1] +
                         metric1[(long)(metric_inv[5]._4_4_ * 6) + 1] *
                         n_vectors[ref_private_macro_code_rss_1 * 3]) +
                         n_vectors[ref_private_macro_code_rss_1 * 3] *
                         (metric1[(long)(metric_inv[5]._4_4_ * 6) + 4] *
                          n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + 1] +
                         metric1[(long)(metric_inv[5]._4_4_ * 6) + 1] *
                         n_vectors[(long)(ref_private_macro_code_rss_1 * 3) + -1] +
                         metric1[(long)(metric_inv[5]._4_4_ * 6) + 3] *
                         n_vectors[ref_private_macro_code_rss_1 * 3]));
        if (local_268 * 1e+20 <= 0.0) {
          local_248 = -(local_268 * 1e+20);
        }
        else {
          local_248 = local_268 * 1e+20;
        }
        if (local_248 <= 1.0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x71a,"ref_metric_smr",4,"inf h1");
          return 4;
        }
        local_268 = 1.0 / local_268;
        local_260 = (1.0 / dVar3) * 4.0;
        dVar3 = (1.0 / dVar3) * 0.25;
        local_258 = local_268;
        if (local_268 < dVar3) {
          local_258 = dVar3;
        }
        if (local_258 <= local_260) {
          if (local_268 < dVar3) {
            local_268 = dVar3;
          }
          local_260 = local_268;
        }
        local_260 = local_260 * local_260;
        if (local_260 * 1e+20 <= 0.0) {
          local_270 = -(local_260 * 1e+20);
        }
        else {
          local_270 = local_260 * 1e+20;
        }
        if (local_270 <= 1.0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x720,"ref_metric_smr",4,"zero h^2");
          return 4;
        }
        diagonal_system[(long)ref_private_macro_code_rss_1 + -1] = 1.0 / local_260;
      }
      RVar2 = ref_matrix_inv_gen(3,&local_128,diagonal_system + 0xb);
      if (RVar2 != 0) {
        printf(" unable to invert eigenvectors:\n");
        printf(" %f %f %f\n",local_128,n_vectors[0],n_vectors[1]);
        printf(" %f %f %f\n",n_vectors[2],n_vectors[3],n_vectors[4]);
        printf(" %f %f %f\n",n_vectors[5],n_vectors[6],n_vectors[7]);
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x729,"ref_metric_smr",1,"gen eig");
        return 1;
      }
      uVar1 = ref_matrix_transpose_gen(3,diagonal_system + 0xb,diagonal_system + 2);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x72c,"ref_metric_smr",(ulong)uVar1,"gen eig");
        return uVar1;
      }
      uVar1 = ref_matrix_form_m(&h0,metric + metric_inv[5]._4_4_ * 6);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x72d,"ref_metric_smr",(ulong)uVar1,"reform m");
        return uVar1;
      }
    }
    metric_inv[5]._4_4_ = metric_inv[5]._4_4_ + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_smr(REF_DBL *metric0, REF_DBL *metric1,
                                  REF_DBL *metric, REF_GRID ref_grid) {
  REF_INT node;
  REF_DBL metric_inv[6];
  REF_DBL inv_m1_m2[9];
  REF_DBL n_values[3], n_vectors[9], inv_n_vectors[9];
  REF_DBL diagonal_system[12];
  REF_DBL h0, h1, h, hmax, hmin, h2;
  REF_DBL eig;
  REF_INT i;

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    RSS(ref_matrix_inv_m(&(metric0[6 * node]), metric_inv), "inv");
    RSS(ref_matrix_mult_m(metric_inv, &(metric1[6 * node]), inv_m1_m2), "mult");
    RSS(ref_matrix_diag_gen(3, inv_m1_m2, n_values, n_vectors), "gen eig");
    for (i = 0; i < 3; i++) {
      h0 = ref_matrix_sqrt_vt_m_v(&(metric0[6 * node]), &(n_vectors[i * 3]));
      if (!ref_math_divisible(1.0, h0)) RSS(REF_DIV_ZERO, "inf h0");
      h0 = 1.0 / h0;
      h1 = ref_matrix_sqrt_vt_m_v(&(metric1[6 * node]), &(n_vectors[i * 3]));
      if (!ref_math_divisible(1.0, h1)) RSS(REF_DIV_ZERO, "inf h1");
      h1 = 1.0 / h1;
      hmax = 4.00 * h0;
      hmin = 0.25 * h0;
      h = MIN(hmax, MAX(hmin, h1));
      h2 = h * h;
      if (!ref_math_divisible(1.0, h2)) RSS(REF_DIV_ZERO, "zero h^2");
      eig = 1.0 / h2;
      ref_matrix_eig(diagonal_system, i) = eig;
    }
    if (REF_SUCCESS != ref_matrix_inv_gen(3, n_vectors, inv_n_vectors)) {
      printf(" unable to invert eigenvectors:\n");
      printf(" %f %f %f\n", n_vectors[0], n_vectors[1], n_vectors[2]);
      printf(" %f %f %f\n", n_vectors[3], n_vectors[4], n_vectors[5]);
      printf(" %f %f %f\n", n_vectors[6], n_vectors[7], n_vectors[8]);
      RSS(REF_FAILURE, "gen eig");
    }
    RSS(ref_matrix_transpose_gen(3, inv_n_vectors, &(diagonal_system[3])),
        "gen eig");
    RSS(ref_matrix_form_m(diagonal_system, &(metric[6 * node])), "reform m");
  }

  return REF_SUCCESS;
}